

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::CategoricalMapping::ByteSizeLong(CategoricalMapping *this)

{
  MappingTypeCase MVar1;
  ValueOnUnknownCase VVar2;
  int iVar3;
  string *value;
  int64 value_00;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  CategoricalMapping *this_local;
  
  sStack_18 = 0;
  MVar1 = MappingType_case(this);
  if (MVar1 != MAPPINGTYPE_NOT_SET) {
    if (MVar1 == kStringToInt64Map) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::StringToInt64Map>
                            ((this->MappingType_).stringtoint64map_);
      sStack_18 = sStack_18 + 1;
    }
    else if (MVar1 == kInt64ToStringMap) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::Int64ToStringMap>
                            ((this->MappingType_).int64tostringmap_);
      sStack_18 = sStack_18 + 1;
    }
  }
  VVar2 = ValueOnUnknown_case(this);
  if (VVar2 != VALUEONUNKNOWN_NOT_SET) {
    if (VVar2 == kStrValue) {
      value = strvalue_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value);
      sStack_18 = sVar4 + 2 + sStack_18;
    }
    else if (VVar2 == kInt64Value) {
      value_00 = int64value(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(value_00);
      sStack_18 = sVar4 + 2 + sStack_18;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t CategoricalMapping::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalMapping)
  size_t total_size = 0;

  switch (MappingType_case()) {
    // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
    case kStringToInt64Map: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *MappingType_.stringtoint64map_);
      break;
    }
    // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
    case kInt64ToStringMap: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *MappingType_.int64tostringmap_);
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (ValueOnUnknown_case()) {
    // string strValue = 101;
    case kStrValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->strvalue());
      break;
    }
    // int64 int64Value = 102;
    case kInt64Value: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}